

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound.cpp
# Opt level: O1

YSRESULT __thiscall YsSoundPlayer::SoundData::ConvertTo8Bit(SoundData *this)

{
  uint uVar1;
  uchar *puVar2;
  uchar *puVar3;
  ulong uVar4;
  uchar *puVar5;
  YSRESULT YVar6;
  
  YVar6 = YSOK;
  if (this->bit != 8) {
    if (this->bit == 0x10) {
      uVar1 = this->sizeInBytes;
      puVar3 = (uchar *)operator_new__((ulong)(uVar1 >> 1));
      if ((ulong)uVar1 != 0) {
        puVar2 = this->dat;
        uVar4 = 0;
        puVar5 = puVar3;
        do {
          *puVar5 = puVar2[uVar4];
          uVar4 = uVar4 + 2;
          puVar5 = puVar5 + 1;
        } while (uVar4 < uVar1);
      }
      if (this->dat != (uchar *)0x0) {
        operator_delete__(this->dat);
      }
      this->dat = puVar3;
      this->bit = 8;
      this->sizeInBytes = this->sizeInBytes >> 1;
    }
    else {
      YVar6 = YSERR;
    }
  }
  return YVar6;
}

Assistant:

YSRESULT YsSoundPlayer::SoundData::ConvertTo8Bit(void)
{
	if(bit==8)
	{
		return YSOK;
	}
	else if(bit==16)
	{
		unsigned char *newDat=new unsigned char [sizeInBytes/2];
		for(int i=0; i<sizeInBytes; i+=2)
		{
			newDat[i/2]=dat[i];
		}
		delete [] dat;
		dat=newDat;
		bit=8;
		sizeInBytes/=2;
		return YSOK;
	}
	return YSERR;
}